

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_laplace.cpp
# Opt level: O0

Reals __thiscall
Omega_h::solve_laplacian(Omega_h *this,Mesh *mesh,Reals *initial,Int width,Real tol,Real floor)

{
  bool bVar1;
  LO LVar2;
  Int class_dim;
  I32 IVar3;
  element_type *peVar4;
  ostream *poVar5;
  void *extraout_RDX;
  Reals RVar6;
  Read<double> local_2c0;
  Read<double> local_2b0;
  byte local_299;
  undefined1 local_298 [7];
  bool local_done;
  undefined1 local_288 [40];
  Reals new_state;
  Read<double> local_238;
  allocator local_221;
  string local_220 [32];
  Read<double> local_200;
  undefined1 local_1f0 [8];
  Write<double> new_state_w;
  Read<double> local_1d0;
  Graph local_1c0;
  undefined1 local_1a0 [8];
  Reals new_state_nobc;
  Int niters;
  bool done;
  Read<int> local_178;
  Write<signed_char> local_168;
  undefined1 local_158 [8];
  Read<double> bc_data;
  string local_140 [32];
  undefined1 local_120 [8];
  Reals weights;
  undefined1 local_100 [8];
  LOs b2v;
  undefined1 local_e0 [8];
  Read<signed_char> boundary;
  Read<signed_char> interior;
  Graph star;
  undefined1 local_88 [8];
  CommPtr comm;
  Real floor_local;
  Real tol_local;
  Int width_local;
  Reals *initial_local;
  Mesh *mesh_local;
  Reals *state;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  comm.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)floor;
  bVar1 = Mesh::owners_have_all_upward(mesh,0);
  if (!bVar1) {
    fail("assertion %s failed at %s +%d\n","mesh->owners_have_all_upward(VERT)",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_laplace.cpp"
         ,0xf);
  }
  if (((ulong)(initial->write_).shared_alloc_.alloc & 1) == 0) {
    local_28 = (element_type *)((initial->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_28 = (element_type *)((ulong)(initial->write_).shared_alloc_.alloc >> 3);
  }
  LVar2 = Mesh::nverts(mesh);
  if ((int)((ulong)local_28 >> 3) != LVar2 * width) {
    fail("assertion %s failed at %s +%d\n","initial.size() == mesh->nverts() * width",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_laplace.cpp"
         ,0x10);
  }
  Mesh::comm((Mesh *)local_88);
  Read<double>::Read((Read<double> *)this,initial);
  Mesh::ask_star((Graph *)&interior.write_.shared_alloc_.direct_ptr,mesh,0);
  class_dim = Mesh::dim(mesh);
  mark_by_class_dim((Omega_h *)&boundary.write_.shared_alloc_.direct_ptr,mesh,0,class_dim);
  Read<signed_char>::Read
            ((Read<signed_char> *)&b2v.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)&boundary.write_.shared_alloc_.direct_ptr);
  invert_marks((Omega_h *)local_e0,(Read<signed_char> *)&b2v.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::~Read((Read<signed_char> *)&b2v.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read
            ((Read<signed_char> *)&weights.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)local_e0);
  collect_marked((Omega_h *)local_100,(Read<signed_char> *)&weights.write_.shared_alloc_.direct_ptr)
  ;
  Read<signed_char>::~Read((Read<signed_char> *)&weights.write_.shared_alloc_.direct_ptr);
  if (((ulong)star.a2ab.write_.shared_alloc_.direct_ptr & 1) == 0) {
    local_10._M_pi = *star.a2ab.write_.shared_alloc_.direct_ptr;
  }
  else {
    local_10._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((ulong)star.a2ab.write_.shared_alloc_.direct_ptr >> 3);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_140,"",(allocator *)((long)&bc_data.write_.shared_alloc_.direct_ptr + 7));
  Read<double>::Read((Read<double> *)local_120,(LO)((ulong)local_10._M_pi >> 2),1.0,
                     (string *)local_140);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&bc_data.write_.shared_alloc_.direct_ptr + 7));
  Read<int>::Read(&local_178,(Read<int> *)local_100);
  Read<double>::Read((Read<double> *)&niters,initial);
  unmap<double>((Omega_h *)&local_168,&local_178,(Read<signed_char> *)&niters,width);
  read<double>((Omega_h *)local_158,&local_168);
  Write<double>::~Write((Write<double> *)&local_168);
  Read<double>::~Read((Read<double> *)&niters);
  Read<int>::~Read(&local_178);
  new_state_nobc.write_.shared_alloc_.direct_ptr._7_1_ = 0;
  new_state_nobc.write_.shared_alloc_.direct_ptr._0_4_ = 0;
  do {
    Graph::Graph(&local_1c0,(Graph *)&interior.write_.shared_alloc_.direct_ptr);
    Read<double>::Read(&local_1d0,(Read<double> *)local_120);
    Read<double>::Read((Read<double> *)&new_state_w.shared_alloc_.direct_ptr,(Read<double> *)this);
    graph_weighted_average
              ((Omega_h *)local_1a0,&local_1c0,&local_1d0,
               (Reals *)&new_state_w.shared_alloc_.direct_ptr,width);
    Read<double>::~Read((Read<double> *)&new_state_w.shared_alloc_.direct_ptr);
    Read<double>::~Read(&local_1d0);
    Graph::~Graph(&local_1c0);
    Read<double>::Read(&local_200,(Read<double> *)local_1a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_220,"",&local_221);
    deep_copy<double>((Omega_h *)local_1f0,(Read<signed_char> *)&local_200,(string *)local_220);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    Read<double>::~Read(&local_200);
    Read<double>::Read(&local_238,(Read<double> *)local_158);
    Read<int>::Read((Read<int> *)&stack0xfffffffffffffdb8,(Read<int> *)local_100);
    Write<double>::Write
              ((Write<double> *)&new_state.write_.shared_alloc_.direct_ptr,
               (Write<double> *)local_1f0);
    map_into<double>((Read<signed_char> *)&local_238,(LOs *)&stack0xfffffffffffffdb8,
                     (Write<signed_char> *)&new_state.write_.shared_alloc_.direct_ptr,width);
    Write<double>::~Write((Write<double> *)&new_state.write_.shared_alloc_.direct_ptr);
    Read<int>::~Read((Read<int> *)&stack0xfffffffffffffdb8);
    Read<double>::~Read(&local_238);
    Write<double>::Write((Write<double> *)(local_288 + 0x10),(Write<double> *)local_1f0);
    Read<double>::Read((Read<double> *)(local_288 + 0x20),(Write<double> *)(local_288 + 0x10));
    Write<double>::~Write((Write<double> *)(local_288 + 0x10));
    Read<double>::Read((Read<double> *)local_298,(Read<double> *)(local_288 + 0x20));
    Mesh::sync_array<double>((Mesh *)local_288,(Int)mesh,(Read<double> *)0x0,(Int)local_298);
    Read<double>::operator=((Read<double> *)(local_288 + 0x20),(Read<double> *)local_288);
    Read<double>::~Read((Read<double> *)local_288);
    Read<double>::~Read((Read<double> *)local_298);
    Read<double>::Read(&local_2b0,(Read<double> *)this);
    Read<double>::Read(&local_2c0,(Read<double> *)(local_288 + 0x20));
    bVar1 = are_close(&local_2b0,&local_2c0,tol,
                      (Real)comm.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi);
    Read<double>::~Read(&local_2c0);
    Read<double>::~Read(&local_2b0);
    local_299 = bVar1;
    peVar4 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_88);
    new_state_nobc.write_.shared_alloc_.direct_ptr._7_1_ =
         Comm::reduce_and(peVar4,(bool)(local_299 & 1));
    Read<double>::operator=((Read<double> *)this,(Read<double> *)(local_288 + 0x20));
    new_state_nobc.write_.shared_alloc_.direct_ptr._0_4_ =
         (int)new_state_nobc.write_.shared_alloc_.direct_ptr + 1;
    Read<double>::~Read((Read<double> *)(local_288 + 0x20));
    Write<double>::~Write((Write<double> *)local_1f0);
    Read<double>::~Read((Read<double> *)local_1a0);
  } while (((new_state_nobc.write_.shared_alloc_.direct_ptr._7_1_ ^ 0xff) & 1) != 0);
  peVar4 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_88);
  IVar3 = Comm::rank(peVar4);
  if (IVar3 == 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"laplacian solve took ");
    poVar5 = (ostream *)
             std::ostream::operator<<(poVar5,(int)new_state_nobc.write_.shared_alloc_.direct_ptr);
    std::operator<<(poVar5," iterations\n");
  }
  Read<double>::~Read((Read<double> *)local_158);
  Read<double>::~Read((Read<double> *)local_120);
  Read<int>::~Read((Read<int> *)local_100);
  Read<signed_char>::~Read((Read<signed_char> *)local_e0);
  Read<signed_char>::~Read((Read<signed_char> *)&boundary.write_.shared_alloc_.direct_ptr);
  Graph::~Graph((Graph *)&interior.write_.shared_alloc_.direct_ptr);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr((shared_ptr<Omega_h::Comm> *)local_88);
  RVar6.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar6.write_.shared_alloc_;
}

Assistant:

Reals solve_laplacian(
    Mesh* mesh, Reals initial, Int width, Real tol, Real floor) {
  OMEGA_H_CHECK(mesh->owners_have_all_upward(VERT));
  OMEGA_H_CHECK(initial.size() == mesh->nverts() * width);
  auto comm = mesh->comm();
  auto state = initial;
  auto star = mesh->ask_star(VERT);
  auto interior = mark_by_class_dim(mesh, VERT, mesh->dim());
  auto boundary = invert_marks(interior);
  auto b2v = collect_marked(boundary);
  auto weights = Reals(star.ab2b.size(), 1.0);
  auto bc_data = read(unmap(b2v, initial, width));
  bool done = false;
  Int niters = 0;
  do {
    auto new_state_nobc = graph_weighted_average(star, weights, state, width);
    auto new_state_w = deep_copy(new_state_nobc);
    map_into(bc_data, b2v, new_state_w, width);
    auto new_state = Reals(new_state_w);
    new_state = mesh->sync_array(VERT, new_state, width);
    auto local_done = are_close(state, new_state, tol, floor);
    done = comm->reduce_and(local_done);
    state = new_state;
    ++niters;
  } while (!done);
  if (comm->rank() == 0) {
    std::cout << "laplacian solve took " << niters << " iterations\n";
  }
  return state;
}